

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13ad8::fillChannel<half>(Rand48 *random,DeepImageChannel *c)

{
  uint uVar1;
  ImageChannel *this;
  ImageLevel *this_00;
  Box2i *pBVar2;
  DeepImageLevel *this_01;
  uint *puVar3;
  undefined8 in_RSI;
  int i;
  half *s;
  int n;
  int x;
  int y;
  SampleCountChannel *scc;
  Box2i *dataWindow;
  TypedDeepImageChannel<half> *tc;
  undefined2 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffba;
  float in_stack_ffffffffffffffbc;
  SampleCountChannel *in_stack_ffffffffffffffc0;
  int local_30;
  int local_2c;
  
  this = (ImageChannel *)
         __dynamic_cast(in_RSI,&Imf_2_5::DeepImageChannel::typeinfo,
                        &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0);
  if (this == (ImageChannel *)0x0) {
    __cxa_bad_cast();
  }
  this_00 = Imf_2_5::ImageChannel::level(this);
  pBVar2 = Imf_2_5::ImageLevel::dataWindow(this_00);
  this_01 = Imf_2_5::DeepImageChannel::deepLevel((DeepImageChannel *)0x11e2e5);
  Imf_2_5::DeepImageLevel::sampleCounts(this_01);
  for (local_2c = (pBVar2->min).y; local_2c <= (pBVar2->max).y; local_2c = local_2c + 1) {
    for (local_30 = (pBVar2->min).x; local_30 <= (pBVar2->max).x; local_30 = local_30 + 1) {
      puVar3 = Imf_2_5::SampleCountChannel::at
                         (in_stack_ffffffffffffffc0,(int)in_stack_ffffffffffffffbc,
                          CONCAT22(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8));
      uVar1 = *puVar3;
      in_stack_ffffffffffffffc0 =
           (SampleCountChannel *)
           Imf_2_5::TypedDeepImageChannel<half>::at
                     ((TypedDeepImageChannel<half> *)in_stack_ffffffffffffffc0,
                      (int)in_stack_ffffffffffffffbc,
                      CONCAT22(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8));
      for (in_stack_ffffffffffffffbc = 0.0; (int)in_stack_ffffffffffffffbc < (int)uVar1;
          in_stack_ffffffffffffffbc = (float)((int)in_stack_ffffffffffffffbc + 1)) {
        Imath_2_5::Rand48::nextf
                  ((Rand48 *)in_stack_ffffffffffffffc0,
                   (double)CONCAT44(in_stack_ffffffffffffffbc,
                                    CONCAT22(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8)),
                   (double)this);
        half::half((half *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        *(undefined2 *)
         ((long)&(in_stack_ffffffffffffffc0->super_ImageChannel)._vptr_ImageChannel +
         (long)(int)in_stack_ffffffffffffffbc * 2) = in_stack_ffffffffffffffba;
      }
    }
  }
  return;
}

Assistant:

void
fillChannel (Rand48 &random, DeepImageChannel &c)
{
    //
    // Fill image channel tc with random numbers
    //

    TypedDeepImageChannel<T> &tc =
        dynamic_cast <TypedDeepImageChannel<T>&> (c);

    const Box2i &dataWindow = tc.level().dataWindow();
    const SampleCountChannel &scc = c.deepLevel().sampleCounts();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
    {
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
        {
            int n = scc.at (x, y);
            T* s = tc.at (x, y);

            for (int i = 0; i < n; ++i)
                s[i] = T (random.nextf (0.0, 100.0));
        }
    }
}